

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content_without_length(Stream *strm,ContentReceiverWithProgress *out)

{
  bool bVar1;
  int iVar2;
  int extraout_var;
  ssize_t n;
  uint64_t r;
  char buf [4096];
  ContentReceiverWithProgress *out_local;
  Stream *strm_local;
  unsigned_long __args_1;
  
  n = 0;
  while( true ) {
    iVar2 = (*strm->_vptr_Stream[4])(strm,&r,0x1000);
    __args_1 = CONCAT44(extraout_var,iVar2);
    if (extraout_var < 0) {
      return false;
    }
    if (__args_1 == 0) break;
    bVar1 = std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::
            operator()(out,(char *)&r,__args_1,n,0);
    if (!bVar1) {
      return false;
    }
    n = __args_1 + n;
  }
  return true;
}

Assistant:

inline bool read_content_without_length(Stream &strm,
                                        ContentReceiverWithProgress out) {
  char buf[CPPHTTPLIB_RECV_BUFSIZ];
  uint64_t r = 0;
  for (;;) {
    auto n = strm.read(buf, CPPHTTPLIB_RECV_BUFSIZ);
    if (n < 0) {
      return false;
    } else if (n == 0) {
      return true;
    }

    if (!out(buf, static_cast<size_t>(n), r, 0)) { return false; }
    r += static_cast<uint64_t>(n);
  }

  return true;
}